

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O1

void GenCodeCmdMemCopy(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Reg xVar1;
  uint uVar2;
  
  if (((ulong)cmd >> 0x20 & 3) != 0) {
    __assert_fail("cmd.argument % 4 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGenRegVm_X86.cpp"
                  ,0x651,"void GenCodeCmdMemCopy(CodeGenRegVmContext &, RegVmCmd)");
  }
  uVar2 = cmd._0_4_ >> 0x18;
  if (uVar2 == 3) {
    xVar1 = rEBX;
LAB_002b7cf4:
    EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,xVar1);
  }
  else {
    if (uVar2 == 2) {
      xVar1 = rR14;
      goto LAB_002b7cf4;
    }
    if (uVar2 == 1) {
      xVar1 = rR15;
      goto LAB_002b7cf4;
    }
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rESI,sQWORD,rEBX,uVar2 << 3);
  }
  if (cmd.rA == '\x03') {
    xVar1 = rEBX;
  }
  else {
    uVar2 = cmd._1_4_ & 0xff;
    if (uVar2 == 2) {
      xVar1 = rR14;
    }
    else {
      if (uVar2 != 1) {
        EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,(cmd._1_4_ & 0xff) << 3);
        goto LAB_002b7d96;
      }
      xVar1 = rR15;
    }
  }
  EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,xVar1);
LAB_002b7d96:
  EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,cmd.argument >> 2);
  EMIT_OP(&ctx->ctx,o_rep_movsd);
  return;
}

Assistant:

void GenCodeCmdMemCopy(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	assert(cmd.argument % 4 == 0);

#if defined(_M_X64)
	// Load source pointer

	if(cmd.rC == rvrrFrame)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR15);
	else if(cmd.rC == rvrrConstants)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR14);
	else if(cmd.rC == rvrrRegisters)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rRBX);
	else
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRSI, sQWORD, rREG, cmd.rC * 8);

	// Load target pointer
	if(cmd.rA == rvrrFrame)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rR15);
	else if(cmd.rA == rvrrConstants)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rR14);
	else if(cmd.rA == rvrrRegisters)
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rRBX);
	else
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rA * 8);

	EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument >> 2);
	EMIT_OP(ctx.ctx, o_rep_movsd);
#else
	EMIT_OP_REG_REG(ctx.ctx, o_mov, rEDX, rESI);
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rESI, sDWORD, rREG, cmd.rC * 8); // Load source pointer
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rA * 8); // Load target pointer
	EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument >> 2);
	EMIT_OP(ctx.ctx, o_rep_movsd);
	EMIT_OP_REG_REG(ctx.ctx, o_mov, rESI, rEDX);
	EMIT_REG_READ(ctx.ctx, rESI);
#endif
}